

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void nuts_tran_perf(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_msg *pnVar5;
  undefined1 *puVar6;
  nng_time nVar7;
  size_t *psVar8;
  nng_err result_;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  nng_msg *local_50;
  nng_msg *msg;
  nng_time local_40;
  nng_socket local_38;
  nng_socket local_34;
  nng_socket s1;
  nng_socket s2;
  
  pcVar4 = strchr(scheme,0x36);
  if ((pcVar4 != (char *)0x0) && (_Var1 = nuts_has_ipv6(), !_Var1)) {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0x216,"No IPv6 support present");
    return;
  }
  putchar(10);
  nng_log_set_logger(nng_stderr_logger);
  nng_log_set_level(NNG_LOG_NOTICE);
  nVar2 = nng_pair1_open(&local_38);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x218,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open(&local_34);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x219,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar4
                           ,nVar2);
    if (iVar3 != 0) {
      nuts_scratch_addr_zero(scheme,0x40,nuts_tran_perf::nuts_addr_);
      nVar2 = nng_socket_set_ms(local_38,"send-timeout",100);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x21b,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms(local_34,"send-timeout",100);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x21c,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms(local_38,"recv-timeout",100);
          pcVar4 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x21d,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms(local_34,"recv-timeout",100);
            pcVar4 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x21e,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
            if (iVar3 != 0) {
              nVar2 = nuts_marry_ex(local_38,local_34,nuts_tran_perf::nuts_addr_,(nng_pipe *)0x0,
                                    (nng_pipe *)0x0);
              pcVar4 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x21f,"%s: expected success, got %s (%d)",
                                     "nuts_marry_ex(s1, s2, addr, ((void*)0), ((void*)0))",pcVar4,
                                     nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_msg_alloc(&local_50,0x40);
                pcVar4 = nng_strerror(nVar2);
                uVar9 = 0;
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x220,"%s: expected success, got %s (%d)",
                                       "nng_msg_alloc(&msg, 64)",pcVar4,nVar2);
                if (iVar3 != 0) {
                  nng_log_notice(scheme,"Exchanging 64 byte messages for 10 seconds");
                  pnVar5 = (nng_msg *)nng_clock();
                  psVar8 = &pnVar5[0x28].m_body.ch_len;
                  puVar6 = (undefined1 *)nng_clock();
                  if (puVar6 < psVar8) {
                    uVar9 = 0;
                    do {
                      nVar2 = nng_sendmsg(local_38,local_50,0);
                      if (nVar2 != NNG_OK) {
                        pcVar4 = nng_strerror(nVar2);
                        iVar3 = acutest_check_(0,
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x22b,"%s: expected success, got %s (%d)","rv",
                                               pcVar4,nVar2);
                        if (iVar3 == 0) goto LAB_0011d74a;
                        pcVar4 = "nng_sendmsg failed";
LAB_0011d4fa:
                        acutest_message_(pcVar4);
                        break;
                      }
                      nVar2 = nng_recvmsg(local_34,&local_50,0);
                      if (nVar2 != NNG_OK) {
                        pcVar4 = nng_strerror(nVar2);
                        iVar3 = acutest_check_(0,
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x230,"%s: expected success, got %s (%d)","rv",
                                               pcVar4,nVar2);
                        if (iVar3 != 0) {
                          pcVar4 = "nng_recvmsg failed";
                          goto LAB_0011d4fa;
                        }
                        goto LAB_0011d74a;
                      }
                      uVar9 = uVar9 + 1;
                      puVar6 = (undefined1 *)nng_clock();
                    } while (puVar6 < psVar8);
                  }
                  nVar7 = nng_clock();
                  nng_msg_free(local_50);
                  puVar6 = (undefined1 *)nng_clock();
                  for (uVar10 = uVar9; uVar10 != 0; uVar10 = uVar10 - 1) {
                    msg = pnVar5;
                    local_40 = nVar7;
                    psVar8 = (size_t *)nng_clock();
                    if ((psVar8 < puVar6) &&
                       (iVar3 = acutest_check_(0,
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x23e,"%s","end >= now"), iVar3 == 0))
                    goto LAB_0011d74a;
                    pnVar5 = msg;
                    nVar7 = local_40;
                  }
                  uVar11 = (long)psVar8 - (long)puVar6;
                  iVar3 = acutest_check_((uint)(puVar6 <= psVar8),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x241,"%s","end >= now");
                  if ((iVar3 != 0) &&
                     (iVar3 = acutest_check_((uint)(uVar11 < 10000),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x242,"%s","end - now < 10000"), iVar3 != 0)) {
                    iVar3 = (int)nVar7 - ((int)pnVar5 + (int)uVar11);
                    local_40 = CONCAT44(local_40._4_4_,(float)(int)uVar9);
                    dVar12 = (double)iVar3 / 1000.0;
                    msg = (nng_msg *)(double)(int)uVar9;
                    nng_log_notice(scheme,"Did %u roundtrips in %0.2f seconds (%0.3f msg/sec)",
                                   dVar12,(double)msg / dVar12,(ulong)uVar9);
                    nng_log_notice(scheme,"RTT %0.3f ms",(double)((float)iVar3 / (float)local_40));
                    auVar13._8_4_ = (int)(uVar11 >> 0x20);
                    auVar13._0_8_ = uVar11;
                    auVar13._12_4_ = 0x45300000;
                    nng_log_notice(scheme,"Timing overhead %0.3f ms, %0.3f us/msg",(double)uVar11,
                                   (((auVar13._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0))
                                   * 1000.0) / (double)msg);
                    nVar2 = nng_socket_close(local_38);
                    pcVar4 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x24b,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(s1)",pcVar4,nVar2);
                    if (iVar3 != 0) {
                      nVar2 = nng_socket_close(local_34);
                      pcVar4 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x24c,"%s: expected success, got %s (%d)",
                                             "nng_socket_close(s2)",pcVar4,nVar2);
                      if (iVar3 != 0) {
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011d74a:
  acutest_abort_();
}

Assistant:

void
nuts_tran_perf(const char *scheme)
{
	nng_socket  s1;
	nng_socket  s2;
	const char *addr;
	nng_msg    *msg;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	nuts_set_logger(NNG_LOG_NOTICE);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_MARRY_EX(s1, s2, addr, NULL, NULL);
	NUTS_PASS(nng_msg_alloc(&msg, 64));
	nng_log_notice(scheme, "Exchanging 64 byte messages for 10 seconds");
	nng_time     now = nng_clock();
	nng_time     end = now + 10000; // ten seconds
	nng_duration delta;
	int          rv;
	int          num = 0;

	// count round trips for 10 seconds
	while (nng_clock() < end) {
		if ((rv = nng_sendmsg(s1, msg, 0)) != 0) {
			NUTS_PASS(rv);
			NUTS_MSG("nng_sendmsg failed");
			break;
		}
		if ((rv = nng_recvmsg(s2, &msg, 0)) != 0) {
			NUTS_PASS(rv);
			NUTS_MSG("nng_recvmsg failed");
			break;
		}
		num++;
	}
	delta = (nng_clock() - now);
	nng_msg_free(msg);

	// now count the cost of the time collection
	now = nng_clock();
	for (int i = 0; i < num; i++) {
		end = nng_clock();
		if (end < now) {
			NUTS_ASSERT(end >= now);
		}
	}
	NUTS_ASSERT(end >= now);
	NUTS_ASSERT(end - now < 10000);
	// remove the cost of timing
	delta -= (end - now);
	nng_log_notice(scheme,
	    "Did %u roundtrips in %0.2f seconds (%0.3f msg/sec)", num,
	    delta / 1000.0, (float) num / (delta / 1000.0));
	nng_log_notice(scheme, "RTT %0.3f ms", (float) delta / (float) num);
	nng_log_notice(scheme, "Timing overhead %0.3f ms, %0.3f us/msg",
	    (float) (end - now), (end - now) * 1000.0 / (float) num);
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}